

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Lexer.cpp
# Opt level: O2

void __thiscall
psy::C::Lexer::DiagnosticsReporter::IncompatibleLanguageExtension
          (DiagnosticsReporter *this,string *feature,Ext expectedExt)

{
  SyntaxTree *this_00;
  IndexType tkIdx;
  Ext ext;
  allocator<char> local_189;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  string local_108 [32];
  DiagnosticDescriptor local_e8;
  DiagnosticDescriptor descriptor;
  
  std::__cxx11::string::string(local_108,(string *)&ID_of_IncompatibleLanguageExtension_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"Incompatible language extension",&local_189);
  std::operator+(&local_168,feature," is available in ");
  to_string_abi_cxx11_(&local_188,(C *)(ulong)expectedExt,ext);
  std::operator+(&local_148,&local_168,&local_188);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&descriptor,local_108,local_128,&local_148,1,1);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  this_00 = this->lexer_->tree_;
  DiagnosticDescriptor::DiagnosticDescriptor(&local_e8,&descriptor);
  tkIdx = SyntaxTree::freeTokenSlot(this->lexer_->tree_);
  SyntaxTree::newDiagnostic(this_00,&local_e8,tkIdx);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_e8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&descriptor);
  return;
}

Assistant:

void Lexer::DiagnosticsReporter::IncompatibleLanguageExtension(
        const std::string& feature,
        LanguageExtensions::Ext expectedExt)
{
    DiagnosticDescriptor descriptor(ID_of_IncompatibleLanguageExtension,
                                    "Incompatible language extension",
                                    feature + " is available in " + to_string(expectedExt),
                                    DiagnosticSeverity::Warning,
                                    DiagnosticCategory::Syntax);

    lexer_->tree_->newDiagnostic(descriptor, lexer_->tree_->freeTokenSlot());
}